

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void changeLpCosts(HighsLp *lp,HighsIndexCollection *index_collection,
                  vector<double,_std::allocator<double>_> *new_col_cost,double infinite_cost)

{
  bool bVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  pointer piVar6;
  int iVar7;
  int iVar8;
  HighsInt to_k;
  HighsInt from_k;
  int local_38;
  int local_34;
  
  limits(index_collection,&local_34,&local_38);
  if (local_34 <= local_38) {
    bVar5 = index_collection->is_interval_;
    bVar1 = index_collection->is_mask_;
    piVar2 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (new_col_cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + local_34;
    iVar7 = -1;
    do {
      iVar8 = local_34;
      if (((bVar5 | bVar1) & 1U) == 0) {
        iVar8 = *piVar6;
      }
      iVar7 = iVar7 + 1;
      if (bVar5 == false) {
        iVar7 = local_34;
      }
      if (((bVar1 & 1U) == 0) || (piVar2[iVar8] != 0)) {
        pdVar4[iVar8] = pdVar3[iVar7];
      }
      local_34 = local_34 + 1;
      piVar6 = piVar6 + 1;
    } while (local_38 + 1 != local_34);
    if (lp->has_infinite_cost_ != false) {
      bVar5 = HighsLp::hasInfiniteCost(lp,infinite_cost);
      lp->has_infinite_cost_ = bVar5;
    }
  }
  return;
}

Assistant:

void changeLpCosts(HighsLp& lp, const HighsIndexCollection& index_collection,
                   const vector<double>& new_col_cost,
                   const double infinite_cost) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  const bool& interval = index_collection.is_interval_;
  const bool& mask = index_collection.is_mask_;
  const vector<HighsInt>& col_set = index_collection.set_;
  const vector<HighsInt>& col_mask = index_collection.mask_;

  // Change the costs to the user-supplied costs, according to the technique
  HighsInt lp_col;
  HighsInt usr_col = -1;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (interval || mask) {
      lp_col = k;
    } else {
      lp_col = col_set[k];
    }
    HighsInt col = lp_col;
    if (interval) {
      usr_col++;
    } else {
      usr_col = k;
    }
    if (mask && !col_mask[col]) continue;
    lp.col_cost_[col] = new_col_cost[usr_col];
  }
  // Check whether the LP still has an infinite cost
  if (lp.has_infinite_cost_)
    lp.has_infinite_cost_ = lp.hasInfiniteCost(infinite_cost);
}